

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isHandleType(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  
  pTVar2 = getCanonicalType(this);
  SVar1 = (pTVar2->super_Symbol).kind;
  return (bool)((byte)(0x416c00000 >> ((byte)SVar1 & 0x3f)) & SVar1 < TypeAlias);
}

Assistant:

bool Type::isHandleType() const {
    auto ct = &getCanonicalType();
    switch (ct->kind) {
        case SymbolKind::VirtualInterfaceType:
        case SymbolKind::ClassType:
        case SymbolKind::CHandleType:
        case SymbolKind::CovergroupType:
        case SymbolKind::EventType:
        case SymbolKind::NullType:
            return true;
        default:
            return false;
    }
}